

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

_Bool CrawlOperators(Lexer *lexer)

{
  char cVar1;
  byte bVar2;
  _Bool _Var3;
  ushort **ppuVar4;
  int iVar5;
  
  iVar5 = (lexer->tracker).currentTokenPosition;
  if (lexer->length <= iVar5) {
    PeekNextCharacter(lexer);
    iVar5 = (lexer->tracker).currentTokenPosition;
    (lexer->tracker).tokenStart = iVar5;
    _Var3 = false;
    goto switchD_0010410d_caseD_22;
  }
  cVar1 = lexer->rawSourceCode[iVar5];
  bVar2 = PeekNextCharacter(lexer);
  iVar5 = (lexer->tracker).currentTokenPosition;
  (lexer->tracker).tokenStart = iVar5;
  _Var3 = false;
  switch(cVar1) {
  case '!':
  case '%':
  case '*':
  case '/':
  case '=':
switchD_0010410d_caseD_21:
    if (bVar2 == 0x3d) goto LAB_00104119;
    break;
  case '\"':
  case '\'':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '?':
    goto switchD_0010410d_caseD_22;
  case '#':
  case '$':
  case '(':
  case ')':
  case ',':
  case ':':
  case ';':
  case '@':
    break;
  case '&':
    if ((bVar2 - 0x26 < 0x39) && ((0x100000000800001U >> ((ulong)(bVar2 - 0x26) & 0x3f) & 1) != 0))
    goto LAB_00104119;
    break;
  case '+':
    if ((bVar2 == 0x3d) || (bVar2 == 0x2b)) goto LAB_00104119;
    break;
  case '-':
    if ((bVar2 < 0x3f) && ((0x6000200000000000U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      GetNextCharacter(lexer);
    }
    ppuVar4 = __ctype_b_loc();
    if ((byte)(bVar2 == 0x2e | (*(byte *)((long)*ppuVar4 + (long)(char)bVar2 * 2 + 1) & 8) >> 3) ==
        1) {
LAB_00104209:
      CrawlNumbers(lexer);
    }
    break;
  case '.':
    ppuVar4 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar4 + (long)(char)bVar2 * 2 + 1) & 8) != 0) goto LAB_00104209;
    break;
  case '<':
    if (((bVar2 & 0xef) == 0x2d) || (bVar2 == 0x3c)) goto LAB_00104119;
    break;
  case '>':
    if (bVar2 != 0x3e) {
LAB_0010423f:
      if (bVar2 != 0x3d) break;
    }
LAB_00104119:
    GetNextCharacter(lexer);
    break;
  default:
    switch(cVar1) {
    case '[':
    case ']':
    case '`':
      break;
    case '\\':
    case '_':
      goto switchD_0010410d_caseD_22;
    case '^':
      goto switchD_0010410d_caseD_21;
    default:
      if (cVar1 != '{') {
        if (cVar1 == '|') {
          if (bVar2 != 0x7c) goto LAB_0010423f;
          goto LAB_00104119;
        }
        _Var3 = false;
        if (cVar1 != '}') goto switchD_0010410d_caseD_22;
      }
    }
  }
  GetNextCharacter(lexer);
  iVar5 = (lexer->tracker).currentTokenPosition;
  _Var3 = true;
switchD_0010410d_caseD_22:
  (lexer->tracker).tokenEnd = iVar5;
  return _Var3;
}

Assistant:

bool CrawlOperators(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	SetTokenStart(lexer);
	switch (currentChar){
		case '/': {
			if (nextChar == '/' || nextChar == '*') {} // TODO: Eat Comments
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '*': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '=': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '+': {
			if (nextChar == '+' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '-': {
			if (nextChar == '-' || nextChar == '=' || nextChar == '>') GetNextCharacter(lexer);
			if (isdigit(nextChar) || nextChar == '.') CrawlNumbers(lexer);
			break;
		}
		case '%': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '<': {
			if (nextChar == '-' || nextChar == '=') GetNextCharacter(lexer);
			else if (nextChar == '<') GetNextCharacter(lexer); // TODO: Implement <<=
			break;
		}
		case '>': {
			if (nextChar == '=') GetNextCharacter(lexer);
			else if (nextChar == '>') GetNextCharacter(lexer); // TODO: Implement >>=
			break;
		}
		case '!': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '&': {
			if (nextChar == '&' || nextChar == '^' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '|': {
			if (nextChar == '|' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '^': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '.': {
			if (isdigit(nextChar)) CrawlNumbers(lexer);
			break;
		}
		case '`':
		case '@':
		case '$':
		case ';':
		case ',':
		case '(':
		case ')':
		case '[':
		case ']':
		case '{':
		case '}':
		case '#':
		case ':': break;
		default: {
			SetTokenEnd(lexer);
			return false;
		}
	}
	GetNextCharacter(lexer);
	SetTokenEnd(lexer);
	return true;
}